

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

SocketAddress * __thiscall
kj::anon_unknown_30::NetworkAddressImpl::chooseOneAddress(NetworkAddressImpl *this)

{
  uint uVar1;
  ulong uVar2;
  Fault f;
  Fault local_10;
  
  uVar2 = (this->addrs).size_;
  if (uVar2 != 0) {
    uVar1 = this->counter;
    this->counter = uVar1 + 1;
    return (this->addrs).ptr + (ulong)uVar1 % uVar2;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x4d0,FAILED,"addrs.size() > 0","\"No addresses available.\"",
             (char (*) [24])"No addresses available.");
  _::Debug::Fault::fatal(&local_10);
}

Assistant:

const SocketAddress& chooseOneAddress() {
    KJ_REQUIRE(addrs.size() > 0, "No addresses available.");
    return addrs[counter++ % addrs.size()];
  }